

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int kernel_w;
  int kernel_h;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pMVar6;
  Mat *top_blob;
  int *piVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int _c;
  int iVar10;
  ulong uVar11;
  Allocator **ppAVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  void *pvVar18;
  ulong uVar19;
  void *pvVar20;
  void *pvVar21;
  ulong uVar22;
  ulong uVar23;
  void *pvVar24;
  long lVar25;
  uint uVar26;
  undefined1 auVar27 [16];
  Option *opt_00;
  Mat local_198;
  Option *local_148;
  pointer local_140;
  long local_138;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_130;
  void *local_128;
  void *local_120;
  undefined1 local_118 [32];
  Allocator *local_f8;
  int iStack_f0;
  int iStack_ec;
  undefined8 uStack_e8;
  int local_e0;
  size_t local_d8;
  Mat local_c8;
  Mat local_78;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  top_blob = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  iVar16 = pMVar6->c;
  kernel_w = pMVar6[1].w;
  _c = this->group * pMVar6[1].d;
  kernel_h = pMVar6[1].h;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_130 = bottom_blobs;
  flatten(pMVar6 + 1,&local_78,opt);
  iVar10 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_0042c64b;
  local_c8.cstep = 0;
  uVar26 = kernel_h * kernel_w;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  local_140 = pMVar6;
  Mat::create(&local_c8,(int)(uVar26 * iVar16 * _c) / this->group,4,opt->workspace_allocator);
  pMVar6 = local_140;
  iVar10 = -100;
  local_120 = local_c8.data;
  if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
    iVar10 = this->group;
    local_138 = (long)iVar10;
    if (0 < local_138) {
      uVar17 = (long)iVar16 / (long)iVar10;
      uVar15 = uVar17 & 0xffffffff;
      uVar11 = (long)_c / (long)iVar10 & 0xffffffff;
      local_128 = local_78.data;
      uVar22 = (ulong)uVar26;
      iVar13 = (int)uVar17;
      iVar10 = (int)((long)_c / (long)iVar10);
      iVar16 = 0;
      lVar25 = 0;
      do {
        if (0 < iVar10) {
          pvVar21 = (void *)((long)local_c8.data + (long)iVar16 * 4);
          pvVar20 = (void *)((long)local_78.data + (long)iVar16 * 4);
          uVar17 = 0;
          do {
            if (0 < iVar13) {
              uVar23 = 0;
              pvVar18 = pvVar21;
              pvVar24 = pvVar20;
              do {
                if (0 < (int)uVar26) {
                  uVar19 = 0;
                  do {
                    *(undefined4 *)((long)pvVar18 + uVar19 * 4) =
                         *(undefined4 *)((long)pvVar24 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar22 != uVar19);
                }
                uVar23 = uVar23 + 1;
                pvVar18 = (void *)((long)pvVar18 + uVar22 * 4);
                pvVar24 = (void *)((long)pvVar24 + uVar11 * uVar22 * 4);
              } while (uVar23 != uVar15);
            }
            uVar17 = uVar17 + 1;
            pvVar21 = (void *)((long)pvVar21 + uVar15 * uVar22 * 4);
            pvVar20 = (void *)((long)pvVar20 + uVar22 * 4);
          } while (uVar17 != uVar11);
        }
        lVar25 = lVar25 + 1;
        iVar16 = iVar16 + iVar13 * uVar26 * iVar10;
      } while (lVar25 != local_138);
    }
    local_d8 = 0;
    local_118._0_8_ = (void *)0x0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    local_118._16_12_ = SUB1612((undefined1  [16])0x0,4);
    local_f8 = (Allocator *)0x0;
    iStack_f0 = 0;
    iStack_ec = 0;
    uStack_e8._0_4_ = 0;
    uStack_e8._4_4_ = 0;
    local_e0 = 0;
    local_148 = opt;
    if (this->bias_term == 0) {
LAB_0042c336:
      iVar16 = this->dilation_w;
      iVar10 = pMVar6->w;
      iVar13 = this->stride_w;
      iVar1 = this->dilation_h;
      iVar2 = pMVar6->h;
      iVar3 = this->stride_h;
      ppAVar12 = &opt->workspace_allocator;
      iVar4 = this->output_pad_right;
      iVar5 = this->output_pad_bottom;
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      auVar27._0_4_ = -(uint)(0 < this->pad_left);
      auVar27._4_4_ = -(uint)(0 < this->pad_right);
      auVar27._8_4_ = -(uint)(0 < this->pad_top);
      auVar27._12_4_ = -(uint)(0 < this->pad_bottom);
      iVar14 = movmskps(kernel_h,auVar27);
      if ((iVar14 == 0) && ((this->output_w < 1 || (this->output_h < 1)))) {
        if (&local_198 != top_blob) {
          piVar7 = top_blob->refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          local_198.data = top_blob->data;
          local_198.refcount._0_4_ = SUB84(top_blob->refcount,0);
          local_198.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
          local_198.elemsize = top_blob->elemsize;
          local_198.elempack = top_blob->elempack;
          local_198.allocator = top_blob->allocator;
          uVar8 = top_blob->dims;
          uVar9 = top_blob->w;
          local_198.h = top_blob->h;
          local_198.d = top_blob->d;
          local_198.c = top_blob->c;
          local_198.cstep = top_blob->cstep;
          local_198.dims = uVar8;
          local_198.w = uVar9;
        }
        ppAVar12 = &opt->blob_allocator;
      }
      opt_00 = (Option *)0x42c4ca;
      Mat::create(&local_198,iVar4 + (kernel_w + -1) * iVar16 + (iVar10 + -1) * iVar13 + 1,
                  iVar5 + 1 + (kernel_h + -1) * iVar1 + (iVar2 + -1) * iVar3,_c,4,*ppAVar12);
      iVar10 = -100;
      if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
        deconvolutiondepthwise
                  (local_140,&local_198,&local_c8,(Mat *)local_118,kernel_w,kernel_h,this->stride_w,
                   this->stride_h,this->dilation_w,this->dilation_h,this->group,
                   this->activation_type,&this->activation_params,opt_00);
        cut_padding(this,&local_198,top_blob,local_148);
        if ((top_blob->data == (void *)0x0) ||
           (iVar10 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
          iVar10 = -100;
        }
      }
      piVar7 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      flatten((local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,(Mat *)local_118,opt);
      iVar10 = -100;
      if (((void *)local_118._0_8_ != (void *)0x0) && ((long)local_e0 * local_d8 != 0))
      goto LAB_0042c336;
    }
    piVar7 = (int *)CONCAT44(local_118._12_4_,local_118._8_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_f8 == (Allocator *)0x0) {
          if ((void *)local_118._0_8_ != (void *)0x0) {
            free((void *)local_118._0_8_);
          }
        }
        else {
          (*local_f8->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0042c64b:
  piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int DeconvolutionDepthWise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}